

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_build.cpp
# Opt level: O3

void Omega_h::build_from_elems2verts
               (Mesh *mesh,CommPtr *comm,Omega_h_Family family,Int edim,LOs *ev2v,
               Read<long> *vert_globals)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *this;
  LOs local_68;
  GOs local_58;
  GOs local_48;
  GOs local_38;
  
  Mesh::set_comm(mesh,comm);
  Mesh::set_parting(mesh,OMEGA_H_ELEM_BASED,false);
  Mesh::set_family(mesh,family);
  Mesh::set_dim(mesh,edim);
  local_48.write_.shared_alloc_.alloc = (vert_globals->write_).shared_alloc_.alloc;
  if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
      local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_48.write_.shared_alloc_.alloc =
           (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_48.write_.shared_alloc_.alloc)->use_count =
           (local_48.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_48.write_.shared_alloc_.alloc;
  local_48.write_.shared_alloc_.direct_ptr = (vert_globals->write_).shared_alloc_.direct_ptr;
  build_verts_from_globals(mesh,&local_48);
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
    }
  }
  local_68.write_.shared_alloc_.alloc = (ev2v->write_).shared_alloc_.alloc;
  if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
      local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_68.write_.shared_alloc_.alloc =
           (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_68.write_.shared_alloc_.alloc)->use_count =
           (local_68.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  pAVar2 = local_68.write_.shared_alloc_.alloc;
  local_68.write_.shared_alloc_.direct_ptr = (ev2v->write_).shared_alloc_.direct_ptr;
  local_58.write_.shared_alloc_.alloc = (vert_globals->write_).shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this = local_58.write_.shared_alloc_.alloc;
  local_58.write_.shared_alloc_.direct_ptr = (vert_globals->write_).shared_alloc_.direct_ptr;
  local_38.write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_38.write_.shared_alloc_.direct_ptr = (void *)0x0;
  build_ents_from_elems2verts(mesh,&local_68,&local_58,&local_38);
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    piVar1 = &pAVar2->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar2);
      operator_delete(pAVar2,0x48);
      return;
    }
  }
  return;
}

Assistant:

void build_from_elems2verts(Mesh* mesh, CommPtr comm, Omega_h_Family family,
    Int edim, LOs ev2v, Read<GO> vert_globals) {
  mesh->set_comm(comm);
  mesh->set_parting(OMEGA_H_ELEM_BASED);
  mesh->set_family(family);
  mesh->set_dim(edim);
  build_verts_from_globals(mesh, vert_globals);
  build_ents_from_elems2verts(mesh, ev2v, vert_globals);
}